

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O1

Bac_Man_t * Psr_ManBuildCba(char *pFileName,Vec_Ptr_t *vDes)

{
  void **ppvVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Bac_Man_t *p;
  char *pcVar6;
  size_t sVar7;
  Abc_Nam_t *pAVar8;
  Bac_Ntk_t *pBVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  void *pvVar12;
  int iVar13;
  long lVar14;
  long *plVar15;
  long lVar16;
  Psr_Ntk_t *local_68;
  int local_54;
  Vec_Int_t *local_50;
  Bac_Man_t *local_48;
  Vec_Ptr_t *local_40;
  long local_38;
  
  iVar5 = vDes->nSize;
  if ((long)iVar5 < 1) {
    local_68 = (Psr_Ntk_t *)0x0;
  }
  else {
    local_68 = (Psr_Ntk_t *)*vDes->pArray;
  }
  p = (Bac_Man_t *)calloc(1,0x530);
  pcVar6 = Extra_FileDesignName(pFileName);
  p->pName = pcVar6;
  if (pFileName == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pFileName);
    pcVar6 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar6,pFileName);
  }
  p->pSpec = pcVar6;
  pAVar8 = Abc_NamStart(1000,0x18);
  p->pStrs = pAVar8;
  pAVar8 = Abc_NamStart(1000,0x18);
  p->pMods = pAVar8;
  p->iRoot = 1;
  p->nNtks = iVar5;
  sVar7 = (long)iVar5 + 1;
  lVar16 = 0xd0;
  pBVar9 = (Bac_Ntk_t *)calloc(sVar7,0xd0);
  p->pNtks = pBVar9;
  if (0 < iVar5) {
    do {
      *(Bac_Man_t **)((long)&pBVar9->pDesign + lVar16) = p;
      lVar16 = lVar16 + 0xd0;
    } while ((sVar7 & 0xffffffff) * 0xd0 - lVar16 != 0);
  }
  Bac_ManSetupTypes(p->pPrimNames,p->pPrimSymbs);
  uVar3 = Abc_NamObjNumMax(local_68->pStrs);
  iVar13 = uVar3 + 1;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < uVar3) {
    iVar5 = iVar13;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar5;
  if (iVar5 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar10->pArray = piVar11;
  pVVar10->nSize = iVar13;
  if (piVar11 != (int *)0x0) {
    memset(piVar11,0xff,(long)iVar13 << 2);
  }
  iVar5 = (local_68->vObjs).nSize;
  local_50 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar13 = iVar5;
  }
  local_50->nSize = 0;
  local_50->nCap = iVar13;
  if (iVar13 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)iVar13 << 2);
  }
  local_50->pArray = piVar11;
  Abc_NamDeref(p->pStrs);
  pAVar8 = Abc_NamRef(local_68->pStrs);
  p->pStrs = pAVar8;
  if (0 < vDes->nSize) {
    lVar16 = 0xd0;
    lVar14 = 0;
    local_48 = p;
    local_40 = vDes;
    do {
      if (lVar14 < local_48->nNtks) {
        plVar15 = (long *)((long)&local_48->pNtks->pDesign + lVar16);
      }
      else {
        plVar15 = (long *)0x0;
      }
      local_68 = (Psr_Ntk_t *)vDes->pArray[lVar14];
      iVar5 = local_68->iModuleName;
      iVar13 = (local_68->vInputs).nSize;
      iVar2 = (local_68->vOutputs).nSize;
      local_38 = lVar16;
      iVar4 = Psr_NtkCountObjects(local_68);
      if (*plVar15 == 0) {
        __assert_fail("pNew->pDesign != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x218,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      if (*(int *)((long)plVar15 + 0x24) != 0) {
        __assert_fail("Bac_NtkPiNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x219,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      if (*(int *)((long)plVar15 + 0x34) != 0) {
        __assert_fail("Bac_NtkPoNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x21a,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      *(int *)(plVar15 + 1) = iVar5;
      *(undefined8 *)((long)plVar15 + 0xc) = 0xffffffffffffffff;
      *(undefined4 *)((long)plVar15 + 0x14) = 0xffffffff;
      if ((int)plVar15[4] < iVar13) {
        if ((void *)plVar15[5] == (void *)0x0) {
          pvVar12 = malloc((long)iVar13 << 2);
        }
        else {
          pvVar12 = realloc((void *)plVar15[5],(long)iVar13 << 2);
        }
        plVar15[5] = (long)pvVar12;
        if (pvVar12 == (void *)0x0) goto LAB_003b8e6e;
        *(int *)(plVar15 + 4) = iVar13;
      }
      if ((int)plVar15[6] < iVar2) {
        if ((void *)plVar15[7] == (void *)0x0) {
          pvVar12 = malloc((long)iVar2 << 2);
        }
        else {
          pvVar12 = realloc((void *)plVar15[7],(long)iVar2 << 2);
        }
        plVar15[7] = (long)pvVar12;
        if (pvVar12 == (void *)0x0) goto LAB_003b8e6e;
        *(int *)(plVar15 + 6) = iVar2;
      }
      vDes = local_40;
      if ((int)plVar15[10] < iVar4) {
        if ((void *)plVar15[0xb] == (void *)0x0) {
          pvVar12 = malloc((long)iVar4);
        }
        else {
          pvVar12 = realloc((void *)plVar15[0xb],(long)iVar4);
        }
        plVar15[0xb] = (long)pvVar12;
        *(int *)(plVar15 + 10) = iVar4;
      }
      if ((int)plVar15[0xc] < iVar4) {
        if ((void *)plVar15[0xd] == (void *)0x0) {
          pvVar12 = malloc((long)iVar4 << 2);
        }
        else {
          pvVar12 = realloc((void *)plVar15[0xd],(long)iVar4 << 2);
        }
        plVar15[0xd] = (long)pvVar12;
        if (pvVar12 == (void *)0x0) {
LAB_003b8e6e:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        *(int *)(plVar15 + 0xc) = iVar4;
      }
      pAVar8 = *(Abc_Nam_t **)(*plVar15 + 0x18);
      pcVar6 = Abc_NamStr(*(Abc_Nam_t **)(*plVar15 + 0x10),iVar5);
      iVar13 = Abc_NamStrFindOrAdd(pAVar8,pcVar6,&local_54);
      lVar16 = *plVar15;
      if (local_54 == 0) {
        iVar5 = (int)((ulong)((long)plVar15 - *(long *)(lVar16 + 0x28)) >> 4) * -0x3b13b13b;
        if ((iVar5 < 1) || (*(int *)(lVar16 + 0x24) < iVar5)) {
          __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
        }
        if (iVar13 != iVar5) {
          __assert_fail("NtkId == Bac_NtkId(pNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0x228,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
        }
      }
      else {
        Abc_NamStr(*(Abc_Nam_t **)(lVar16 + 0x10),iVar5);
        printf("Network with name %s already exists.\n");
      }
      lVar14 = lVar14 + 1;
      lVar16 = local_38 + 0xd0;
      p = local_48;
    } while (lVar14 < vDes->nSize);
  }
  if ((((local_68->field_0x4 & 1) == 0) &&
      (((local_68->field_0x4 & 2) == 0 || (iVar5 = Psr_ManIsMapped(local_68), iVar5 == 0)))) ||
     (iVar5 = Bac_NtkBuildLibrary(p), iVar5 != 0)) {
    if (0 < vDes->nSize) {
      lVar16 = 0xd0;
      lVar14 = 0;
      do {
        if (lVar14 < p->nNtks) {
          pBVar9 = (Bac_Ntk_t *)((long)&p->pNtks->pDesign + lVar16);
        }
        else {
          pBVar9 = (Bac_Ntk_t *)0x0;
        }
        ppvVar1 = vDes->pArray + lVar14;
        lVar14 = lVar14 + 1;
        Psr_ManBuildNtk(pBVar9,vDes,(Psr_Ntk_t *)*ppvVar1,pVVar10,local_50);
        lVar16 = lVar16 + 0xd0;
      } while (lVar14 < vDes->nSize);
    }
  }
  else {
    if (0 < p->nNtks) {
      lVar16 = 0x198;
      lVar14 = 0;
      do {
        pBVar9 = p->pNtks;
        pvVar12 = *(void **)((long)pBVar9 + lVar16 + -0xa0);
        if (pvVar12 != (void *)0x0) {
          free(pvVar12);
          *(undefined8 *)((long)pBVar9 + lVar16 + -0xa0) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar16 + -0xa8) = 0;
        pvVar12 = *(void **)((long)pBVar9 + lVar16 + -0x90);
        if (pvVar12 != (void *)0x0) {
          free(pvVar12);
          *(undefined8 *)((long)pBVar9 + lVar16 + -0x90) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar16 + -0x98) = 0;
        pvVar12 = *(void **)((long)pBVar9 + lVar16 + -0x80);
        if (pvVar12 != (void *)0x0) {
          free(pvVar12);
          *(undefined8 *)((long)pBVar9 + lVar16 + -0x80) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar16 + -0x88) = 0;
        pvVar12 = *(void **)((long)pBVar9 + lVar16 + -0x70);
        if (pvVar12 != (void *)0x0) {
          free(pvVar12);
          *(undefined8 *)((long)pBVar9 + lVar16 + -0x70) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar16 + -0x78) = 0;
        pvVar12 = *(void **)((long)pBVar9 + lVar16 + -0x60);
        if (pvVar12 != (void *)0x0) {
          free(pvVar12);
          *(undefined8 *)((long)pBVar9 + lVar16 + -0x60) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar16 + -0x68) = 0;
        pvVar12 = *(void **)((long)pBVar9 + lVar16 + -0x50);
        if (pvVar12 != (void *)0x0) {
          free(pvVar12);
          *(undefined8 *)((long)pBVar9 + lVar16 + -0x50) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar16 + -0x58) = 0;
        pvVar12 = *(void **)((long)pBVar9 + lVar16 + -0x40);
        if (pvVar12 != (void *)0x0) {
          free(pvVar12);
          *(undefined8 *)((long)pBVar9 + lVar16 + -0x40) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar16 + -0x48) = 0;
        pvVar12 = *(void **)((long)pBVar9 + lVar16 + -0x30);
        if (pvVar12 != (void *)0x0) {
          free(pvVar12);
          *(undefined8 *)((long)pBVar9 + lVar16 + -0x30) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar16 + -0x38) = 0;
        pvVar12 = *(void **)((long)pBVar9 + lVar16 + -0x20);
        if (pvVar12 != (void *)0x0) {
          free(pvVar12);
          *(undefined8 *)((long)pBVar9 + lVar16 + -0x20) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar16 + -0x28) = 0;
        pvVar12 = *(void **)((long)pBVar9 + lVar16 + -0x10);
        if (pvVar12 != (void *)0x0) {
          free(pvVar12);
          *(undefined8 *)((long)pBVar9 + lVar16 + -0x10) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar16 + -0x18) = 0;
        pvVar12 = *(void **)((long)&pBVar9->pDesign + lVar16);
        if (pvVar12 != (void *)0x0) {
          free(pvVar12);
          *(undefined8 *)((long)&pBVar9->pDesign + lVar16) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar16 + -8) = 0;
        lVar14 = lVar14 + 1;
        lVar16 = lVar16 + 0xd0;
      } while (lVar14 < p->nNtks);
    }
    piVar11 = (p->vBuf2LeafNtk).pArray;
    if (piVar11 != (int *)0x0) {
      free(piVar11);
      (p->vBuf2LeafNtk).pArray = (int *)0x0;
    }
    (p->vBuf2LeafNtk).nCap = 0;
    (p->vBuf2LeafNtk).nSize = 0;
    piVar11 = (p->vBuf2LeafObj).pArray;
    if (piVar11 != (int *)0x0) {
      free(piVar11);
      (p->vBuf2LeafObj).pArray = (int *)0x0;
    }
    (p->vBuf2LeafObj).nCap = 0;
    (p->vBuf2LeafObj).nSize = 0;
    piVar11 = (p->vBuf2RootNtk).pArray;
    if (piVar11 != (int *)0x0) {
      free(piVar11);
      (p->vBuf2RootNtk).pArray = (int *)0x0;
    }
    (p->vBuf2RootNtk).nCap = 0;
    (p->vBuf2RootNtk).nSize = 0;
    piVar11 = (p->vBuf2RootObj).pArray;
    if (piVar11 != (int *)0x0) {
      free(piVar11);
      (p->vBuf2RootObj).pArray = (int *)0x0;
    }
    (p->vBuf2RootObj).nCap = 0;
    (p->vBuf2RootObj).nSize = 0;
    Abc_NamDeref(p->pStrs);
    Abc_NamDeref(p->pMods);
    if (p->pName != (char *)0x0) {
      free(p->pName);
      p->pName = (char *)0x0;
    }
    if (p->pSpec != (char *)0x0) {
      free(p->pSpec);
      p->pSpec = (char *)0x0;
    }
    if (p->pNtks != (Bac_Ntk_t *)0x0) {
      free(p->pNtks);
      p->pNtks = (Bac_Ntk_t *)0x0;
    }
    free(p);
    p = (Bac_Man_t *)0x0;
  }
  iVar5 = pVVar10->nSize;
  if ((long)iVar5 < 1) {
    iVar13 = 0;
  }
  else {
    lVar16 = 0;
    iVar13 = 0;
    do {
      iVar13 = iVar13 + (uint)(pVVar10->pArray[lVar16] == -1);
      lVar16 = lVar16 + 1;
    } while (iVar5 != lVar16);
  }
  if (iVar13 != iVar5) {
    __assert_fail("Vec_IntCountEntry(vMap, -1) == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPrsBuild.c"
                  ,0x157,"Bac_Man_t *Psr_ManBuildCba(char *, Vec_Ptr_t *)");
  }
  if (pVVar10->pArray != (int *)0x0) {
    free(pVVar10->pArray);
    pVVar10->pArray = (int *)0x0;
  }
  free(pVVar10);
  pVVar10 = local_50;
  if (local_50->pArray != (int *)0x0) {
    free(local_50->pArray);
    pVVar10->pArray = (int *)0x0;
  }
  free(pVVar10);
  return p;
}

Assistant:

Bac_Man_t * Psr_ManBuildCba( char * pFileName, Vec_Ptr_t * vDes )
{
    Psr_Ntk_t * pNtk = Psr_ManRoot( vDes );  int i;
    Bac_Man_t * pNew = Bac_ManAlloc( pFileName, Vec_PtrSize(vDes) );
    Vec_Int_t * vMap = Vec_IntStartFull( Abc_NamObjNumMax(pNtk->pStrs) + 1 );
    Vec_Int_t * vTmp = Vec_IntAlloc( Psr_NtkBoxNum(pNtk) );
    Abc_NamDeref( pNew->pStrs );
    pNew->pStrs = Abc_NamRef( pNtk->pStrs );  
    Vec_PtrForEachEntry( Psr_Ntk_t *, vDes, pNtk, i )
        Bac_NtkAlloc( Bac_ManNtk(pNew, i+1), Psr_NtkId(pNtk), Psr_NtkPiNum(pNtk), Psr_NtkPoNum(pNtk), Psr_NtkCountObjects(pNtk) );
    if ( (pNtk->fMapped || (pNtk->fSlices && Psr_ManIsMapped(pNtk))) && !Bac_NtkBuildLibrary(pNew) )
        Bac_ManFree(pNew), pNew = NULL;
    else 
        Vec_PtrForEachEntry( Psr_Ntk_t *, vDes, pNtk, i )
            Psr_ManBuildNtk( Bac_ManNtk(pNew, i+1), vDes, pNtk, vMap, vTmp );
    assert( Vec_IntCountEntry(vMap, -1) == Vec_IntSize(vMap) );
    Vec_IntFree( vMap );
    Vec_IntFree( vTmp );
//    Vec_StrPrint( &Bac_ManNtk(pNew, 1)->vType, 1 );
    return pNew;
}